

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O1

bool __thiscall
Saturation::PredicateSplitPassiveClauseContainer::exceedsWeightLimit
          (PredicateSplitPassiveClauseContainer *this,uint w,uint numPositiveLiterals,
          Inference *inference)

{
  pointer pfVar1;
  pointer puVar2;
  __uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  _Var3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  float extraout_XMM0_Da;
  
  (*(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
    _vptr_ClauseContainer[0x15])(this,(ulong)numPositiveLiterals,inference);
  pfVar1 = (this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar7 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (extraout_XMM0_Da <= pfVar1[uVar6]) break;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < (ulong)(lVar7 >> 2));
  }
  puVar2 = (this->_queues).
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->_queues).
                super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
  bVar8 = uVar5 <= uVar6;
  if ((uVar6 < uVar5) &&
     (_Var3._M_t.
      super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
      .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
           puVar2[uVar6]._M_t.
           super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
           ._M_t,
     cVar4 = (**(code **)(*(long *)_Var3._M_t.
                                   super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                   .
                                   super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                   ._M_head_impl + 0x88))
                       (_Var3._M_t.
                        super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                        .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                        _M_head_impl,w,numPositiveLiterals,inference), cVar4 != '\0')) {
    uVar9 = (uint)uVar6;
    do {
      uVar9 = uVar9 + 1;
      uVar5 = (ulong)uVar9;
      puVar2 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->_queues).
                    super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
      bVar8 = uVar6 <= uVar5;
      if (uVar6 <= uVar5) {
        return bVar8;
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
      .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
           puVar2[uVar5]._M_t.
           super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
           ._M_t;
      cVar4 = (**(code **)(*(long *)_Var3._M_t.
                                    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                    .
                                    super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                    ._M_head_impl + 0x88))
                        (_Var3._M_t.
                         super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                         .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                         _M_head_impl,w,numPositiveLiterals,inference);
    } while (cVar4 != '\0');
  }
  return bVar8;
}

Assistant:

bool PredicateSplitPassiveClauseContainer::exceedsWeightLimit(unsigned w, unsigned numPositiveLiterals, const Inference& inference) const
{
  auto bestQueueIndex = bestQueue(evaluateFeatureEstimate(numPositiveLiterals, inference));
  // note: even for non-layered-arrangements, we need to go through all queues, since the values for age, w, ... are only lower bounds (in the sense that the actual value could lead to a worse bestQueueIndex)
  for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
  {
    auto& queue = _queues[i];
    if (!queue->exceedsWeightLimit(w, numPositiveLiterals, inference))
    {
      return false;
    }
  }
  return true;
}